

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

bool DiffTest<Blob<256>,unsigned_long>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> diffs;
  Rand local_98;
  unsigned_long h2;
  unsigned_long h1;
  Blob<256> k2;
  Blob<256> k1;
  
  dVar3 = chooseUpToK(0x100,diffbits);
  diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.x = 0x331facd4;
  local_98.y = 0x1046679a;
  local_98.z = 0x5cd2ef35;
  local_98.w = 0xfda8c6ef;
  diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _0_16_ = ZEXT816(0) << 0x20;
  k2.bytes = (uint8_t  [32])(ZEXT832(0) << 0x20);
  k1.bytes = k2.bytes;
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         (ulong)(uint)diffbits,0x100,0x40);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",dVar3 * (double)reps,
         dVar3 * (double)reps * 5.421010862427522e-20,(ulong)(uint)reps);
  if (0 < reps) {
    uVar2 = 0;
    do {
      if ((int)((ulong)uVar2 % ((ulong)(uint)reps / 10)) == 0) {
        putchar(0x2e);
      }
      Rand::rand_p(&local_98,&k1,0x20);
      k2 = k1;
      (*hash)(&k1,0x20,0,&h1);
      DiffTestRecurse<Blob<256>,unsigned_long>(hash,&k1,&k2,&h1,&h2,0,diffbits,&diffs);
      uVar2 = uVar2 + 1;
    } while (reps != uVar2);
  }
  putchar(10);
  bVar1 = ProcessDifferentials<Blob<256>>(&diffs,reps,dumpCollisions);
  if (diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}